

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

int polyscope::dimension(TextureFormat *x)

{
  runtime_error *this;
  undefined4 *in_RDI;
  int local_4;
  
  switch(*in_RDI) {
  case 0:
    local_4 = 3;
    break;
  case 1:
    local_4 = 4;
    break;
  case 2:
    local_4 = 2;
    break;
  case 3:
    local_4 = 3;
    break;
  case 4:
    local_4 = 4;
    break;
  case 5:
    local_4 = 4;
    break;
  case 6:
    local_4 = 3;
    break;
  case 7:
    local_4 = 1;
    break;
  case 8:
    local_4 = 1;
    break;
  case 9:
    local_4 = 1;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"bad enum");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_4;
}

Assistant:

int dimension(const TextureFormat& x) {
  // clang-format off
  switch (x) {
    case TextureFormat::RGB8:     return 3;
    case TextureFormat::RGBA8:    return 4;
    case TextureFormat::RG16F:    return 2;
    case TextureFormat::RGB16F:   return 3;
    case TextureFormat::RGBA16F:  return 4;
    case TextureFormat::R32F:     return 1;
    case TextureFormat::R16F:     return 1;
    case TextureFormat::RGB32F:   return 3;
    case TextureFormat::RGBA32F:  return 4;
    case TextureFormat::DEPTH24:  return 1;
  }
  // clang-format on
  throw std::runtime_error("bad enum");
}